

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::ConversionError::ConversionError
          (ConversionError *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_stack_ffffffffffffff10;
  allocator *paVar1;
  allocator local_c9;
  string local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff78;
  ConversionError *in_stack_ffffffffffffff80;
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  ::std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ::std::operator+(in_RDX,in_stack_ffffffffffffff10);
  paVar1 = &local_c9;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_c8,",",paVar1);
  detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)name,(string *)results);
  ::std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ConversionError(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ::std::__cxx11::string::~string(local_38);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  ::std::__cxx11::string::~string(local_c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

ConversionError(std::string name, std::vector<std::string> results)
        : ConversionError("Could not convert: " + name + " = " + detail::join(results)) {}